

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

_Bool ITStatus_push_back(ARM_ITStatus *it,char v)

{
  char v_local;
  ARM_ITStatus *it_local;
  
  if (7 < it->size) {
    it->size = 0;
  }
  it->ITStates[it->size] = v;
  it->size = it->size + 1;
  return true;
}

Assistant:

static bool ITStatus_push_back(ARM_ITStatus *it, char v)
{
	if (it->size >= sizeof(it->ITStates)) {
		// TODO: consider warning user.
		it->size = 0;
	}
	it->ITStates[it->size] = v;
	it->size++;

	return true;
}